

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pedersen_impl.h
# Opt level: O1

void secp256k1_pedersen_ecmult
               (secp256k1_gej *rj,secp256k1_scalar *sec,uint64_t value,secp256k1_ge *value_gen,
               secp256k1_ge *blind_gen)

{
  secp256k1_gej bj;
  secp256k1_scalar vs;
  secp256k1_ge bp;
  secp256k1_gej sStack_118;
  secp256k1_scalar local_98;
  secp256k1_ge local_78;
  
  local_98.d[1] = 0;
  local_98.d[2] = 0;
  local_98.d[3] = 0;
  local_98.d[0] = value;
  secp256k1_ecmult_const(rj,value_gen,&local_98,0x40);
  secp256k1_ecmult_const(&sStack_118,blind_gen,sec,0x100);
  if (sStack_118.infinity == 0) {
    secp256k1_ge_set_gej(&local_78,&sStack_118);
    secp256k1_gej_add_ge(rj,rj,&local_78);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_pedersen_ecmult(secp256k1_gej *rj, const secp256k1_scalar *sec, uint64_t value, const secp256k1_ge* value_gen, const secp256k1_ge* blind_gen) {
    secp256k1_scalar vs;
    secp256k1_gej bj;
    secp256k1_ge bp;

    secp256k1_scalar_set_u64(&vs, value);
    secp256k1_ecmult_const(rj, value_gen, &vs, 64);
    secp256k1_ecmult_const(&bj, blind_gen, sec, 256);

    /* zero blinding factor indicates that we are not trying to be zero-knowledge,
     * so not being constant-time in this case is OK. */
    if (!secp256k1_gej_is_infinity(&bj)) {
        secp256k1_ge_set_gej(&bp, &bj);
        secp256k1_gej_add_ge(rj, rj, &bp);
    }

    secp256k1_gej_clear(&bj);
    secp256k1_ge_clear(&bp);
    secp256k1_scalar_clear(&vs);
}